

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  TokenList *args_1;
  FunctionPrototypeSyntax *args_2;
  ClassMethodPrototypeSyntax *pCVar1;
  DeepCloneVisitor visitor;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = deepClone((TokenList *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = (FunctionPrototypeSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x88),(DeepCloneVisitor *)&local_40,
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,args_1,args_2,&local_40);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClassMethodPrototypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClassMethodPrototypeSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.qualifiers, alloc),
        *deepClone<FunctionPrototypeSyntax>(*node.prototype, alloc),
        node.semi.deepClone(alloc)
    );
}